

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O1

void __thiscall
kj::_::Debug::Fault::
Fault<kj::Exception::Type,kj::_::DebugComparison<char&,char>&,char_const(&)[50]>
          (Fault *this,char *file,int line,Type code,char *condition,char *macroArgs,
          DebugComparison<char_&,_char> *params,char (*params_1) [50])

{
  long lVar1;
  undefined8 uVar2;
  char (*params_00) [50];
  long lVar3;
  String argValues [2];
  char **ppcVar4;
  undefined8 uVar5;
  undefined1 local_92;
  _ local_91;
  char *local_90;
  char **local_88;
  undefined8 uStack_80;
  char *local_78;
  size_t local_70;
  ArrayDisposer *pAStack_68;
  String local_60;
  String local_48;
  
  this->exception = (Exception *)0x0;
  local_91 = *(_ *)params->left;
  local_92 = params->right;
  local_90 = macroArgs;
  concat<kj::FixedArray<char,1ul>,kj::StringPtr&,kj::FixedArray<char,1ul>>
            (&local_48,&local_91,(FixedArray<char,_1UL> *)&params->op,(StringPtr *)&local_92,
             (FixedArray<char,_1UL> *)condition);
  local_78 = local_48.content.ptr;
  local_70 = local_48.content.size_;
  pAStack_68 = local_48.content.disposer;
  str<char_const(&)[50]>(&local_60,(kj *)params_1,params_00);
  ppcVar4 = &local_78;
  uStack_80 = 2;
  uVar5 = 2;
  local_88 = ppcVar4;
  init(this,(EVP_PKEY_CTX *)file);
  lVar3 = 0x18;
  do {
    lVar1 = *(long *)((long)&local_78 + lVar3);
    if (lVar1 != 0) {
      uVar2 = *(undefined8 *)((long)&local_70 + lVar3);
      *(undefined8 *)((long)&local_78 + lVar3) = 0;
      *(undefined8 *)((long)&local_70 + lVar3) = 0;
      (**(code **)**(undefined8 **)((long)&pAStack_68 + lVar3))
                (*(undefined8 **)((long)&pAStack_68 + lVar3),lVar1,1,uVar2,uVar2,0,ppcVar4,uVar5);
    }
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  return;
}

Assistant:

Debug::Fault::Fault(const char* file, int line, Code code,
                    const char* condition, const char* macroArgs, Params&&... params)
    : exception(nullptr) {
  String argValues[sizeof...(Params)] = {str(params)...};
  init(file, line, code, condition, macroArgs,
       arrayPtr(argValues, sizeof...(Params)));
}